

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

ImGuiContext * ImGui::CreateContext(ImFontAtlas *shared_font_atlas)

{
  ImGuiContext *this;
  
  this = (ImGuiContext *)MemAlloc(0x3bf0);
  ImGuiContext::ImGuiContext(this,shared_font_atlas);
  if (GImGui == (ImGuiContext *)0x0) {
    GImGui = this;
  }
  Initialize(this);
  return this;
}

Assistant:

ImGuiContext* ImGui::CreateContext(ImFontAtlas* shared_font_atlas)
{
    ImGuiContext* ctx = IM_NEW(ImGuiContext)(shared_font_atlas);
    if (GImGui == NULL)
        SetCurrentContext(ctx);
    Initialize(ctx);
    return ctx;
}